

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_slliq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 t;
  uint uVar1;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0xb & 0x1f;
  ret = tcg_temp_new_i64(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_rotli_i64_ppc64
            (tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),uVar1);
  gen_load_spr(tcg_ctx,t,0);
  gen_store_spr(tcg_ctx,0,ret);
  uVar1 = -1 << (sbyte)uVar1;
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,(ulong)uVar1);
  tcg_gen_andi_i64_ppc64(tcg_ctx,t,t,(ulong)~uVar1);
  tcg_gen_or_i64_ppc64(tcg_ctx,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],ret,t);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)));
  return;
}

Assistant:

static void gen_slliq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sh = SH(ctx->opcode);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_rotli_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], sh);
    gen_load_spr(tcg_ctx, t1, SPR_MQ);
    gen_store_spr(tcg_ctx, SPR_MQ, t0);
    tcg_gen_andi_tl(tcg_ctx, t0, t0,  (0xFFFFFFFFU << sh));
    tcg_gen_andi_tl(tcg_ctx, t1, t1, ~(0xFFFFFFFFU << sh));
    tcg_gen_or_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}